

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void btreeEnterAll(sqlite3 *db)

{
  Btree *p;
  int iVar1;
  u8 uVar2;
  long lVar3;
  long lVar4;
  
  iVar1 = db->nDb;
  uVar2 = '\x01';
  if (0 < iVar1) {
    lVar3 = 8;
    lVar4 = 0;
    uVar2 = '\x01';
    do {
      p = *(Btree **)((long)&db->aDb->zDbSName + lVar3);
      if ((p != (Btree *)0x0) && (p->sharable != '\0')) {
        p->wantToLock = p->wantToLock + 1;
        if (p->locked == '\0') {
          btreeLockCarefully(p);
          iVar1 = db->nDb;
        }
        uVar2 = '\0';
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (lVar4 < iVar1);
  }
  db->noSharedCache = uVar2;
  return;
}

Assistant:

static void SQLITE_NOINLINE btreeEnterAll(sqlite3 *db){
  int i;
  int skipOk = 1;
  Btree *p;
  assert( sqlite3_mutex_held(db->mutex) );
  for(i=0; i<db->nDb; i++){
    p = db->aDb[i].pBt;
    if( p && p->sharable ){
      sqlite3BtreeEnter(p);
      skipOk = 0;
    }
  }
  db->noSharedCache = skipOk;
}